

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

HRESULT __thiscall
Js::ByteCodeBufferBuilder::AddOneScopeInfo
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,ScopeInfo *scopeInfo,
          LocalScopeInfoId parentId)

{
  PropertyId id;
  ImmutableList<Js::BufferBuilder_*> *pIVar1;
  FunctionInfo *pFVar2;
  code *pcVar3;
  undefined4 *puVar4;
  BufferBuilderList *pBVar5;
  bool bVar6;
  PropertyId value;
  BufferBuilder *pBVar7;
  ImmutableList<Js::BufferBuilder_*> *pIVar8;
  ScopeInfo *pSVar9;
  int value_00;
  uint uVar10;
  long lVar11;
  ScopeInfo *pSVar12;
  BufferBuilderInt32 *local_60;
  BufferBuilderInt32 *startOfScopeInfo;
  undefined4 *local_50;
  ScopeInfo *local_48;
  uint local_40;
  LocalScopeInfoId local_3c;
  BufferBuilderList *local_38;
  
  local_60 = (BufferBuilderInt32 *)0x0;
  local_3c = parentId;
  local_38 = builder;
  PrependInt32(this,builder,L"ScopeInfo symbol count",scopeInfo->symbolCount,&local_60);
  value_00 = 0;
  pBVar7 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x28,this->alloc,0x366bee);
  pBVar7->clue = L"Offset To ScopeInfo";
  pBVar7->offset = 0xffffffff;
  pBVar7->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014f2e80;
  pBVar7[1]._vptr_BufferBuilder = (_func_int **)local_60;
  *(undefined4 *)&pBVar7[1].clue = 0;
  pIVar1 = (this->scopeInfoRelativeOffsets).list;
  pIVar8 = (ImmutableList<Js::BufferBuilder_*> *)
           new<Memory::ArenaAllocator>(0x10,this->alloc,0x366bee);
  pBVar5 = local_38;
  pIVar8->value = pBVar7;
  pIVar8->next = pIVar1;
  (this->scopeInfoRelativeOffsets).list = pIVar8;
  pFVar2 = (scopeInfo->functionInfo).ptr;
  if (pFVar2 != (FunctionInfo *)0x0) {
    value_00 = pFVar2->functionId - this->topFunctionId;
  }
  PrependInt32(this,local_38,L"ScopeInfo FunctionInfo relative id",value_00,
               (BufferBuilderInt32 **)0x0);
  uVar10 = *(ushort *)&scopeInfo->field_0x10 >> 1 & 0x70 | *(ushort *)&scopeInfo->field_0x10 & 0xf;
  PrependByte(this,pBVar5,L"ScopeInfo flags",(byte)uVar10);
  PrependInt32(this,pBVar5,L"ScopeInfo scope type",scopeInfo->scopeType,(BufferBuilderInt32 **)0x0);
  PrependInt32(this,pBVar5,L"ScopeInfo scope id",scopeInfo->scopeId,(BufferBuilderInt32 **)0x0);
  if (DAT_015d346a == '\x01') {
    Output::Trace(ByteCodeSerializationPhase,
                  L"Adding ScopeInfo (0x%p). Flags: %u. Type: %d. ScopeId: %d. Symbol count: %u\n",
                  scopeInfo,(ulong)uVar10,(ulong)scopeInfo->scopeType,
                  (ulong)(uint)scopeInfo->scopeId,scopeInfo->symbolCount);
  }
  local_48 = scopeInfo;
  if (0 < scopeInfo->symbolCount) {
    pSVar12 = scopeInfo + 1;
    local_50 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    lVar11 = 0;
    startOfScopeInfo = (BufferBuilderInt32 *)this;
    do {
      pBVar5 = local_38;
      local_40 = *(byte *)((long)&(pSVar12->functionInfo).ptr + 1) & 0x3f;
      PrependByte(this,local_38,L"SymbolInfo flags",(byte)local_40);
      PrependByte(this,pBVar5,L"SymbolInfo symbol type",*(byte *)&(pSVar12->functionInfo).ptr);
      pSVar9 = pSVar12;
      if ((scopeInfo->field_0x10 & 0x10) != 0) {
        if ((pSVar12->parent).ptr == (ScopeInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = local_50;
          *local_50 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                      ,0x9c6,"(sym->name != nullptr)","sym->name != nullptr");
          if (!bVar6) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar4 = 0;
        }
        pSVar9 = (ScopeInfo *)&((pSVar12->parent).ptr)->functionInfo;
      }
      this = (ByteCodeBufferBuilder *)startOfScopeInfo;
      id = *(PropertyId *)&(pSVar9->parent).ptr;
      value = encodePossiblyBuiltInPropertyId((ByteCodeBufferBuilder *)startOfScopeInfo,id);
      PrependInt32(this,local_38,L"SymbolInfo property id",value,(BufferBuilderInt32 **)0x0);
      if (DAT_015d346a == '\x01') {
        Output::Trace(ByteCodeSerializationPhase,
                      L"\t\tSymbolInfo (0x%p). Flags: %u. Type: %d. PropertyId: %u (%u)\n",pSVar12,
                      (ulong)local_40,(ulong)*(byte *)&(pSVar12->functionInfo).ptr,
                      (ulong)*(uint *)&(pSVar12->parent).ptr,id);
      }
      lVar11 = lVar11 + 1;
      pSVar12 = (ScopeInfo *)&pSVar12->field_0x10;
      scopeInfo = local_48;
    } while (lVar11 < local_48->symbolCount);
  }
  pBVar5 = local_38;
  pSVar12 = (local_48->parent).ptr;
  PrependByte(this,local_38,L"ScopeInfo has parent",pSVar12 != (ScopeInfo *)0x0);
  if (pSVar12 != (ScopeInfo *)0x0) {
    pBVar7 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x18,this->alloc,0x366bee);
    pBVar7->clue = L"ScopeInfo parent LocalId";
    *(undefined8 *)&pBVar7->offset = 0xffffffffffffffff;
    pBVar7->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014f2e48;
    pIVar1 = pBVar5->list;
    pIVar8 = (ImmutableList<Js::BufferBuilder_*> *)
             new<Memory::ArenaAllocator>(0x10,this->alloc,0x366bee);
    pIVar8->value = pBVar7;
    pIVar8->next = pIVar1;
    pBVar5->list = pIVar8;
    if (local_3c == 0xffffffff) {
      local_3c = GetScopeInfoId(this,(local_48->parent).ptr);
    }
    *(LocalScopeInfoId *)&pBVar7->field_0x14 = local_3c;
  }
  return 0;
}

Assistant:

HRESULT AddOneScopeInfo(BufferBuilderList & builder, ScopeInfo* scopeInfo, LocalScopeInfoId parentId = InvalidLocalScopeInfoId)
    {
        BufferBuilderInt32* startOfScopeInfo = nullptr;
        PrependInt32(builder, _u("ScopeInfo symbol count"), scopeInfo->symbolCount, &startOfScopeInfo);

        BufferBuilderRelativeOffset* offsetToScopeInfo = Anew(alloc, BufferBuilderRelativeOffset, _u("Offset To ScopeInfo"), startOfScopeInfo);
        this->scopeInfoRelativeOffsets.list = this->scopeInfoRelativeOffsets.list->Prepend(offsetToScopeInfo, alloc);

        FunctionInfo* functionInfo = scopeInfo->functionInfo;
        uint relativeFunctionId = 0;
        if (functionInfo != nullptr)
        {
            relativeFunctionId = functionInfo->GetLocalFunctionId() - topFunctionId;
        }
        PrependUInt32(builder, _u("ScopeInfo FunctionInfo relative id"), relativeFunctionId);

        ScopeInfoFlags scopeInfoFlags = (ScopeInfoFlags)
            ((scopeInfo->isDynamic ? sifIsDynamic : sifNone)
                | (scopeInfo->isObject ? sifIsObject : sifNone)
                | (scopeInfo->mustInstantiate ? sifMustInstantiate : sifNone)
                | (scopeInfo->isCached ? sifIsCached : sifNone)
                | (scopeInfo->hasLocalInClosure ? sifHasLocalInClosure : sifNone)
                | (scopeInfo->isGeneratorFunctionBody ? sifIsGeneratorFunctionBody : sifNone)
                | (scopeInfo->isAsyncFunctionBody ? sifIsAsyncFunctionBody : sifNone));

        PrependByte(builder, _u("ScopeInfo flags"), scopeInfoFlags);
        PrependInt32(builder, _u("ScopeInfo scope type"), scopeInfo->scopeType);
        PrependInt32(builder, _u("ScopeInfo scope id"), scopeInfo->scopeId);

        OUTPUT_VERBOSE_TRACE(Js::ByteCodeSerializationPhase, _u("Adding ScopeInfo (0x%p). Flags: %u. Type: %d. ScopeId: %d. Symbol count: %u\n"), scopeInfo, scopeInfoFlags, scopeInfo->scopeType, scopeInfo->scopeId, scopeInfo->symbolCount);

        for (int i = 0; i < scopeInfo->symbolCount; i++)
        {
            ScopeInfo::SymbolInfo* sym = scopeInfo->symbols + i;

            SymbolInfoFlags symbolInfoFlags = (SymbolInfoFlags)
                ((sym->hasFuncAssignment ? syifHasFuncAssignment : syifNone)
                    | (sym->isBlockVariable ? syifIsBlockVariable : syifNone)
                    | (sym->isConst ? syifIsConst : syifNone)
                    | (sym->isFuncExpr ? syifIsFuncExpr : syifNone)
                    | (sym->isModuleExportStorage ? syifIsModuleExportStorage : syifNone)
                    | (sym->isModuleImport ? syifIsModuleImport : syifNone));

            PrependByte(builder, _u("SymbolInfo flags"), symbolInfoFlags);
            PrependByte(builder, _u("SymbolInfo symbol type"), (BYTE)sym->symbolType);

            PropertyId symPropertyId = sym->propertyId;
            if (scopeInfo->areNamesCached)
            {
                Assert(sym->name != nullptr);
                symPropertyId = sym->name->GetPropertyId();
            }

            PropertyId propertyId = encodePossiblyBuiltInPropertyId(symPropertyId);
            PrependInt32(builder, _u("SymbolInfo property id"), propertyId);

            OUTPUT_VERBOSE_TRACE(Js::ByteCodeSerializationPhase, _u("\t\tSymbolInfo (0x%p). Flags: %u. Type: %d. PropertyId: %u (%u)\n"), sym, symbolInfoFlags, sym->symbolType, sym->propertyId, symPropertyId);
        }

        bool hasParent = scopeInfo->parent != nullptr;
        PrependBool(builder, _u("ScopeInfo has parent"), hasParent);

        if (hasParent)
        {
            // Prepend an int32 here as a placeholder in case we need to add more bytes into builder for the parent
            auto entry = Anew(alloc, BufferBuilderInt32, _u("ScopeInfo parent LocalId"), InvalidLocalScopeInfoId);
            builder.list = builder.list->Prepend(entry, alloc);

            // If we were not passed a valid pointer id, try and look it up in the map
            if (parentId == InvalidLocalScopeInfoId)
            {
                parentId = GetScopeInfoId(scopeInfo->parent);
            }

            // Update our placeholder with the real id of the parent
            entry->value = parentId;
        }

        return S_OK;
    }